

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O3

void error(String *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Elt_pointer pTVar2;
  _Map_pointer ppTVar3;
  _Map_pointer ppTVar4;
  bool bVar5;
  Lexer *pLVar6;
  runtime_error *this;
  String fileinfo;
  String local_88;
  String local_68;
  String local_48;
  
  pLVar6 = Lexer::GetCurrentLexer();
  local_48._string._M_dataplus._M_p = (pointer)&local_48._string.field_2;
  local_48._string._M_string_length = 0;
  local_48._string.field_2._M_local_buf[0] = '\0';
  if (pLVar6 != (Lexer *)0x0) {
    pTVar2 = (pLVar6->m_tokenPosition)._M_cur;
    ppTVar3 = (pLVar6->m_tokenPosition)._M_node;
    ppTVar4 = (pLVar6->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    bVar5 = ppTVar3 < ppTVar4;
    if (ppTVar3 == ppTVar4) {
      bVar5 = pTVar2 < (pLVar6->m_tokens)._deque.
                       super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    if (bVar5) {
      ppTVar4 = (pLVar6->m_tokens)._deque.
                super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      bVar5 = ppTVar4 <= ppTVar3;
      if (ppTVar3 == ppTVar4) {
        bVar5 = (pLVar6->m_tokens)._deque.
                super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur <= pTVar2;
      }
      if (bVar5) {
        paVar1 = &local_68._string.field_2;
        local_68._string.field_2._M_allocated_capacity = 0x33253a32253a3125;
        local_68._string.field_2._8_2_ = 0x203a;
        local_68._string._M_string_length = 10;
        local_68._string.field_2._M_local_buf[10] = '\0';
        local_68._string._M_dataplus._M_p = (pointer)paVar1;
        format<String,int,int>(&local_88,&local_68,&pTVar2->file,&pTVar2->line,&pTVar2->column);
        std::__cxx11::string::operator=((string *)&local_48,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._string._M_dataplus._M_p != &local_88._string.field_2) {
          operator_delete(local_88._string._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._string._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._string._M_dataplus._M_p);
        }
      }
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  String::operator+(&local_88,&local_48,msg);
  std::runtime_error::runtime_error(this,local_88._string._M_dataplus._M_p);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void error (const String& msg)
{
	Lexer* lx = Lexer::GetCurrentLexer();
	String fileinfo;

	if (lx != null and lx->hasValidToken())
	{
		Lexer::TokenInfo* tk = lx->token();
		fileinfo = format ("%1:%2:%3: ", tk->file, tk->line, tk->column);
	}

    throw std::runtime_error ((fileinfo + msg).c_str());
}